

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModulationType.cpp
# Opt level: O1

bool __thiscall DIS::ModulationType::operator==(ModulationType *this,ModulationType *rhs)

{
  return ((this->_system == rhs->_system && rhs->_detail == this->_detail) &&
         rhs->_major == this->_major) && rhs->_spreadSpectrum == this->_spreadSpectrum;
}

Assistant:

bool ModulationType::operator ==(const ModulationType& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_spreadSpectrum == rhs._spreadSpectrum) ) ivarsEqual = false;
     if( ! (_major == rhs._major) ) ivarsEqual = false;
     if( ! (_detail == rhs._detail) ) ivarsEqual = false;
     if( ! (_system == rhs._system) ) ivarsEqual = false;

    return ivarsEqual;
 }